

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

void __thiscall Executor::handleIf(Executor *this,FunctionCallNode *node)

{
  Value *pVVar1;
  int iVar2;
  undefined4 extraout_var;
  mapped_type *__rhs;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  NumberValueAnalyser analyser;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar2 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar3 = *(long **)CONCAT44(extraout_var,iVar2);
  plVar5 = (long *)plVar3[2];
  (**(code **)(*plVar5 + 0x10))(plVar5,this);
  pVVar1 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  if (pVVar1->valueType_ != F32) {
    __rhs = std::
            unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(&TypeNameStrings_abi_cxx11_,&pVVar1->valueType_);
    std::operator+(&local_40,"Function if expected logical expression, but got ",__rhs);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_60._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_60._M_dataplus._M_p == psVar4) {
      local_60.field_2._M_allocated_capacity = *psVar4;
      local_60.field_2._8_8_ = plVar3[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar4;
    }
    local_60._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    reportError(&local_60,(Node *)node);
  }
  local_60._M_dataplus._M_p = (pointer)&PTR__ValueVisitor_00150c80;
  local_60._M_string_length = local_60._M_string_length & 0xffffffffffffff00;
  local_60.field_2._8_8_ = local_60.field_2._8_8_ & 0xffffffffffffff00;
  (*pVVar1->_vptr_Value[3])(pVVar1);
  if (local_60.field_2._M_local_buf[8] != '\0') {
    plVar5 = (long *)CONCAT44(extraout_var,iVar2) + 1;
    if (0.0001 < ABS((double)local_60.field_2._M_allocated_capacity)) {
      plVar5 = plVar3;
    }
    (**(code **)(**(long **)(*plVar5 + 0x10) + 0x10))(*(long **)(*plVar5 + 0x10),this);
    return;
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::handleIf(const FunctionCallNode& node)
{
  const auto& args = node.getArguments();
  auto it = args.begin();
  (*it)->accept(*this);

  if(value_->getType() != TypeName::F32)
    reportError("Function if expected logical expression, but got " +
                TypeNameStrings.at(value_->getType()) + "!", node);

  NumberValueAnalyser analyser{};
  value_->accept(analyser);
  const auto condition = analyser.getValue().value();

  if(std::fabs(condition) > 0.0001)
  {
    it++;
    (*it)->accept(*this);
  }
  else
  {
    args.back()->accept(*this);
  }
}